

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int nn_poll(nn_pollfd *fds,int nfds,int timeout)

{
  int iVar1;
  pollfd *__fds;
  int *piVar2;
  pollfd *pfd;
  size_t sz;
  int local_30;
  int res;
  int fd;
  int pos;
  int i;
  int rc;
  int timeout_local;
  int nfds_local;
  nn_pollfd *fds_local;
  
  i = timeout;
  rc = nfds;
  _timeout_local = fds;
  __fds = (pollfd *)nn_alloc_((long)nfds << 4);
  if (__fds == (pollfd *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/poll.c"
            ,0x8e);
    fflush(_stderr);
    nn_err_abort();
  }
  res = 0;
  fd = 0;
  do {
    if (fd == rc) {
      pos = poll(__fds,(long)res,i);
      if (pos < 1) {
        piVar2 = __errno_location();
        sz._4_4_ = *piVar2;
        nn_free(__fds);
        iVar1 = sz._4_4_;
        piVar2 = __errno_location();
        *piVar2 = iVar1;
        fds_local._4_4_ = pos;
      }
      else {
        sz._4_4_ = 0;
        res = 0;
        for (fd = 0; fd != rc; fd = fd + 1) {
          _timeout_local[fd].revents = 0;
          if ((_timeout_local[fd].events & 1U) != 0) {
            if ((__fds[res].revents & 1U) != 0) {
              _timeout_local[fd].revents = _timeout_local[fd].revents | 1;
            }
            res = res + 1;
          }
          if ((_timeout_local[fd].events & 2U) != 0) {
            if ((__fds[res].revents & 1U) != 0) {
              _timeout_local[fd].revents = _timeout_local[fd].revents | 2;
            }
            res = res + 1;
          }
          if (_timeout_local[fd].revents != 0) {
            sz._4_4_ = sz._4_4_ + 1;
          }
        }
        nn_free(__fds);
        fds_local._4_4_ = sz._4_4_;
      }
      return fds_local._4_4_;
    }
    if ((_timeout_local[fd].events & 1U) != 0) {
      pfd = (pollfd *)0x4;
      pos = nn_getsockopt(_timeout_local[fd].fd,0,0xb,&local_30,(size_t *)&pfd);
      if (pos < 0) {
        nn_free(__fds);
        iVar1 = -pos;
        piVar2 = __errno_location();
        *piVar2 = iVar1;
        return -1;
      }
      if (pfd != (pollfd *)0x4) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (fd)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/poll.c"
                ,0x99);
        fflush(_stderr);
        nn_err_abort();
      }
      __fds[res].fd = local_30;
      __fds[res].events = 1;
      res = res + 1;
    }
    if ((_timeout_local[fd].events & 2U) != 0) {
      pfd = (pollfd *)0x4;
      pos = nn_getsockopt(_timeout_local[fd].fd,0,10,&local_30,(size_t *)&pfd);
      if (pos < 0) {
        nn_free(__fds);
        iVar1 = -pos;
        piVar2 = __errno_location();
        *piVar2 = iVar1;
        return -1;
      }
      if (pfd != (pollfd *)0x4) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (fd)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/poll.c"
                ,0xa6);
        fflush(_stderr);
        nn_err_abort();
      }
      __fds[res].fd = local_30;
      __fds[res].events = 1;
      res = res + 1;
    }
    fd = fd + 1;
  } while( true );
}

Assistant:

int nn_poll (struct nn_pollfd *fds, int nfds, int timeout)
{
    int rc;
    int i;
    int pos;
    int fd;
    int res;
    size_t sz;
    struct pollfd *pfd;

    /*  Construct a pollset to be used with OS-level 'poll' function. */
    pfd = nn_alloc (sizeof (struct pollfd) * nfds * 2, "pollset");
    alloc_assert (pfd);
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        if (fds [i].events & NN_POLLIN) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_RCVFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                errno = -rc;
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_SNDFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                errno = -rc;
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
    }    

    /*  Do the polling itself. */
    rc = poll (pfd, pos, timeout);
    if (nn_slow (rc <= 0)) {
        res = errno;
        nn_free (pfd);
        errno = res;
        return rc;
    }

    /*  Move the results from OS-level poll to nn_poll's pollset. */
    res = 0;
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        fds [i].revents = 0;
        if (fds [i].events & NN_POLLIN) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLOUT;
            ++pos;
        }
        if (fds [i].revents)
            ++res;
    }

    nn_free (pfd);
    return res;
}